

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

size_type __thiscall wabt::string_view::find(string_view *this,char *s,size_type pos,size_type n)

{
  size_type sVar1;
  string_view s_00;
  
  s_00.size_ = n;
  s_00.data_ = s;
  sVar1 = find(this,s_00,pos);
  return sVar1;
}

Assistant:

string_view::size_type string_view::find(const char* s,
                                         size_type pos,
                                         size_type n) const {
  return find(string_view(s, n), pos);
}